

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::selectNode(DOMRangeImpl *this,DOMNode *refNode)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t XVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar4;
  DOMRangeException *this_00;
  uint uVar5;
  long lVar6;
  DOMRangeImpl *this_01;
  XMLSize_t XVar7;
  
  this_01 = this;
  validateNode(this,refNode);
  bVar1 = isLegalContainedNode(this_01,refNode);
  if (!bVar1) {
    this_00 = (DOMRangeException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException(this_00,0x70,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMRangeException::typeinfo,DOMRangeException::~DOMRangeException);
  }
  iVar2 = (*refNode->_vptr_DOMNode[4])(refNode);
  uVar5 = iVar2 * 0x10000 - 0x30000U >> 0x10;
  if ((uVar5 < 6) && ((0x33U >> (uVar5 & 0x1f) & 1) != 0)) {
    this->fStartOffset = 0;
    this->fStartContainer = refNode;
    this->fEndContainer = refNode;
    if (iVar2 * 0x10000 == 0x70000) {
      iVar2 = (*refNode->_vptr_DOMNode[0x29])();
      XVar3 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var,iVar2));
    }
    else {
      iVar2 = (*refNode->_vptr_DOMNode[0x29])(refNode);
      XVar3 = CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
    iVar2 = (*refNode->_vptr_DOMNode[5])(refNode);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
    if (pDVar4 == (DOMNode *)0x0) {
      return;
    }
    this->fStartContainer = pDVar4;
    this->fEndContainer = pDVar4;
    lVar6 = 0x38;
    XVar3 = 0;
    do {
      XVar7 = XVar3;
      pDVar4 = (DOMNode *)(**(code **)((long)pDVar4->_vptr_DOMNode + lVar6))(pDVar4);
      XVar3 = XVar7 + 1;
      if (pDVar4 == (DOMNode *)0x0) break;
      lVar6 = 0x50;
    } while (pDVar4 != refNode);
    this->fStartOffset = XVar7;
  }
  this->fEndOffset = XVar3;
  return;
}

Assistant:

void DOMRangeImpl::selectNode(const DOMNode* refNode)
{
    validateNode(refNode);
    if ( !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }
    //First check for the text type node
    short type = refNode->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        //The node itself is the container.
        fStartContainer = (DOMNode*) refNode;
        fEndContainer   = (DOMNode*) refNode;

        //Select all the contents of the node
        fStartOffset = 0;
        if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
            fEndOffset = XMLString::stringLen(((DOMProcessingInstruction*)refNode)->getData());
        else
            fEndOffset = ((DOMText *)refNode)->getLength();
        return;
    }

    DOMNode* parent = refNode->getParentNode();
    if (parent != 0 ) // REVIST: what to do if it IS 0?
    {
        fStartContainer = parent;
        fEndContainer = parent;

        XMLSize_t i = 0;
        for (DOMNode* n = parent->getFirstChild(); n!=0 && n!=refNode; n = n->getNextSibling()) {
            i++;
        }

        fStartOffset = i;
        fEndOffset = fStartOffset+1;
    }
}